

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdump::OnExport
          (BinaryReaderObjdump *this,Index index,ExternalKind kind,Index item_index,string_view name
          )

{
  string_view sVar1;
  
  if ((int)kind < 5) {
    PrintDetails(this," - %s[%u]",*(undefined8 *)(g_kind_name + (long)(int)kind * 8),
                 (ulong)item_index);
    if (kind == First) {
      sVar1 = ObjdumpNames::Get(&((this->super_BinaryReaderObjdumpBase).objdump_state_)->
                                 function_names,item_index);
      if (sVar1.size_ != 0) {
        PrintDetails(this," <%.*s>",sVar1.size_,sVar1.data_);
      }
    }
  }
  else {
    PrintDetails(this," - %s[%u]","<error_kind>",(ulong)item_index);
  }
  PrintDetails(this," -> \"%.*s\"\n",name.size_ & 0xffffffff,name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnExport(Index index,
                                     ExternalKind kind,
                                     Index item_index,
                                     string_view name) {
  PrintDetails(" - %s[%" PRIindex "]", GetKindName(kind), item_index);
  if (kind == ExternalKind::Func) {
    auto name = GetFunctionName(item_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
  }

  PrintDetails(" -> \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(name));
  return Result::Ok;
}